

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O1

bool __thiscall
OSSLEDDSA::reconstructParameters
          (OSSLEDDSA *this,AsymmetricParameters **ppParams,ByteString *serialisedData)

{
  int iVar1;
  size_t sVar2;
  AsymmetricParameters *pAVar3;
  
  if ((ppParams != (AsymmetricParameters **)0x0) &&
     (sVar2 = ByteString::size(serialisedData), sVar2 != 0)) {
    pAVar3 = (AsymmetricParameters *)operator_new(0x30);
    (pAVar3->super_Serialisable)._vptr_Serialisable = (_func_int **)0x0;
    pAVar3[1].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    pAVar3[2].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    pAVar3[3].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    pAVar3[4].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    pAVar3[5].super_Serialisable._vptr_Serialisable = (_func_int **)0x0;
    (pAVar3->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_001522c8;
    ByteString::ByteString((ByteString *)(pAVar3 + 1));
    iVar1 = (*(pAVar3->super_Serialisable)._vptr_Serialisable[4])(pAVar3,serialisedData);
    if ((char)iVar1 != '\0') {
      *ppParams = pAVar3;
      return (bool)(char)iVar1;
    }
    (*(pAVar3->super_Serialisable)._vptr_Serialisable[2])(pAVar3);
    return false;
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructParameters(AsymmetricParameters** ppParams, ByteString& serialisedData)
{
	// Check input parameters
	if ((ppParams == NULL) || (serialisedData.size() == 0))
	{
		return false;
	}

	ECParameters* params = new ECParameters();

	if (!params->deserialise(serialisedData))
	{
		delete params;

		return false;
	}

	*ppParams = params;

	return true;
}